

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-quadratic.cpp
# Opt level: O1

double foo(VectorXd *x,VectorXd *grad)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  DenseStorage<double,__1,__1,_1,_0> DVar6;
  double *pdVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  Index index;
  ulong uVar11;
  ActualDstType actualDst;
  long lVar12;
  uint uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  VectorXd d;
  scalar_sum_op<double,_double> local_89;
  DenseStorage<double,__1,__1,_1,_0> local_88;
  Scalar local_70;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_68;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_40;
  
  lVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_88.m_data = (double *)0x0;
  local_88.m_rows = 0;
  DVar6 = local_88;
  local_88.m_data = (double *)0x0;
  uVar13 = (uint)lVar9;
  lVar12 = (long)(int)uVar13;
  pdVar7 = local_88.m_data;
  if (lVar12 != 0) {
    local_88 = DVar6;
    free((void *)0x0);
    if ((int)uVar13 < 1) {
      local_88.m_data = (double *)0x0;
      pdVar7 = local_88.m_data;
    }
    else {
      pdVar7 = (double *)malloc((ulong)(lVar9 << 0x20) >> 0x1d);
      if (pdVar7 == (double *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = operator_delete;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  local_88.m_data = pdVar7;
  auVar4 = _DAT_00106020;
  if (0 < (int)uVar13) {
    lVar9 = (ulong)(uVar13 & 0x7fffffff) - 1;
    auVar15._8_4_ = (int)lVar9;
    auVar15._0_8_ = lVar9;
    auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar10 = 0;
    auVar15 = auVar15 ^ _DAT_00106020;
    auVar17 = _DAT_00106010;
    do {
      auVar18 = auVar17 ^ auVar4;
      if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                  auVar15._4_4_ < auVar18._4_4_) & 1)) {
        local_88.m_data[uVar10] = (double)(int)uVar10;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        local_88.m_data[uVar10 + 1] = (double)((int)uVar10 + 1);
      }
      uVar10 = uVar10 + 2;
      lVar9 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar9 + 2;
    } while ((uVar13 + 1 & 0xfffffffe) != uVar10);
  }
  local_68.m_xpr.m_rhs = (RhsNested)&local_88;
  local_68.m_xpr.m_lhs = x;
  local_88.m_rows = lVar12;
  if (lVar12 == 0) {
    local_70 = 0.0;
  }
  else {
    local_40.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_40.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_88.m_data;
    local_70 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                         (&local_40,&local_89,&local_68);
  }
  pdVar5 = local_88.m_data;
  pdVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if ((grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      local_88.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,local_88.m_rows
               ,1);
  }
  pdVar3 = (grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar10 = (grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar11 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar9 = 0;
    do {
      pdVar1 = pdVar7 + lVar9;
      pdVar2 = pdVar5 + lVar9;
      dVar14 = *pdVar1 - *pdVar2;
      dVar16 = pdVar1[1] - pdVar2[1];
      pdVar1 = pdVar3 + lVar9;
      *pdVar1 = dVar14 + dVar14;
      pdVar1[1] = dVar16 + dVar16;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar10) {
    do {
      dVar14 = pdVar7[uVar11] - pdVar5[uVar11];
      pdVar3[uVar11] = dVar14 + dVar14;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  free(local_88.m_data);
  return local_70;
}

Assistant:

double foo(const VectorXd& x, VectorXd& grad)
{
    const int n = x.size();
    VectorXd d(n);
    for(int i = 0; i < n; i++)
        d[i] = i;

    double f = (x - d).squaredNorm();
    grad.noalias() = 2.0 * (x - d);
    return f;
}